

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance_array_intersector.cpp
# Opt level: O1

void embree::avx512::InstanceArrayIntersector1::intersect
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  uint uVar1;
  Geometry *pGVar2;
  RTCRayQueryContext *pRVar3;
  long *plVar4;
  long lVar5;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  ulong uVar17;
  _func_int *p_Var18;
  long lVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  vfloat4 a0_2;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 in_ZMM0 [64];
  vfloat4 a0;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 in_ZMM1 [64];
  undefined4 uVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 in_ZMM2 [64];
  int iVar39;
  vfloat4 a0_1;
  undefined1 auVar40 [16];
  undefined1 in_ZMM3 [64];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 in_ZMM4 [64];
  vfloat4 b0;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  float fVar47;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  float fVar51;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  float fVar54;
  float fVar58;
  float fVar59;
  vfloat4 a1;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  float fVar60;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  RayQueryContext newcontext;
  
  auVar24 = in_ZMM4._0_16_;
  a0.field_0 = in_ZMM1._0_16_;
  a0_1.field_0 = in_ZMM3._0_16_;
  auVar23 = in_ZMM2._0_16_;
  a0_2.field_0 = in_ZMM0._0_16_;
  uVar1 = prim->primID_;
  pGVar2 = (context->scene->geometries).items[prim->instID_].ptr;
  p_Var18 = *(_func_int **)&pGVar2->field_0x58;
  if (p_Var18 == (_func_int *)0x0) {
    uVar17 = (ulong)*(uint *)(*(long *)&pGVar2[1].time_range.upper +
                             (long)pGVar2[1].intersectionFilterN * (ulong)uVar1);
    if (uVar17 == 0xffffffff) {
      p_Var18 = (_func_int *)0x0;
    }
    else {
      p_Var18 = pGVar2[1].super_RefCount._vptr_RefCount[uVar17];
    }
  }
  if (((p_Var18 != (_func_int *)0x0) && (((ray->super_RayK<1>).mask & pGVar2->mask) != 0)) &&
     (pRVar3 = context->user, pRVar3->instID[0] == 0xffffffff)) {
    pRVar3->instID[0] = prim->instID_;
    pRVar3->instPrimID[0] = uVar1;
    uVar17 = (ulong)prim->primID_;
    plVar4 = *(long **)&pGVar2[1].fnumTimeSegments;
    iVar39 = (int)plVar4[4];
    if ((pGVar2->field_8).field_0x1 == '\x01') {
      if (iVar39 == 0x9134) {
        lVar5 = *plVar4;
        lVar19 = uVar17 * plVar4[2];
        auVar23 = vinsertps_avx(ZEXT416(*(uint *)(lVar5 + lVar19)),
                                ZEXT416(*(uint *)(lVar5 + 0x10 + lVar19)),0x1c);
        a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vinsertps_avx(auVar23,ZEXT416(*(uint *)(lVar5 + 0x20 + lVar19)),0x28);
        auVar23 = vinsertps_avx(ZEXT416(*(uint *)(lVar5 + 4 + lVar19)),
                                ZEXT416(*(uint *)(lVar5 + 0x14 + lVar19)),0x1c);
        auVar24 = vinsertps_avx(auVar23,ZEXT416(*(uint *)(lVar5 + 0x24 + lVar19)),0x28);
        auVar23 = vinsertps_avx(ZEXT416(*(uint *)(lVar5 + 8 + lVar19)),
                                ZEXT416(*(uint *)(lVar5 + 0x18 + lVar19)),0x1c);
        a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       vinsertps_avx(auVar23,ZEXT416(*(uint *)(lVar5 + 0x28 + lVar19)),0x28);
        auVar23 = vinsertps_avx(ZEXT416(*(uint *)(lVar5 + 0xc + lVar19)),
                                ZEXT416(*(uint *)(lVar5 + 0x1c + lVar19)),0x1c);
        auVar23 = vinsertps_avx(auVar23,ZEXT416(*(uint *)(lVar5 + 0x2c + lVar19)),0x28);
      }
      else if (iVar39 == 0x9234) {
        lVar5 = *plVar4;
        lVar19 = uVar17 * plVar4[2];
        auVar24._8_8_ = 0;
        auVar24._0_8_ = *(ulong *)(lVar5 + 4 + lVar19);
        auVar22._8_8_ = 0;
        auVar22._0_8_ = *(ulong *)(lVar5 + 0x10 + lVar19);
        a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar5 + lVar19)),_DAT_02060e80,auVar24);
        auVar24 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar5 + 0xc + lVar19)),_DAT_02060e80,auVar22)
        ;
        auVar20._8_8_ = 0;
        auVar20._0_8_ = *(ulong *)(lVar5 + 0x1c + lVar19);
        a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar5 + 0x18 + lVar19)),_DAT_02060e80,
                                          auVar20);
        auVar21._8_8_ = 0;
        auVar21._0_8_ = *(ulong *)(lVar5 + 0x28 + lVar19);
        auVar23 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar5 + 0x24 + lVar19)),_DAT_02060e80,auVar21
                                    );
      }
      else if (iVar39 == 0xb001) {
        lVar5 = *plVar4;
        lVar19 = uVar17 * plVar4[2];
        auVar27._8_8_ = 0;
        auVar27._0_8_ = *(ulong *)(lVar5 + 0x10 + lVar19);
        auVar24 = vinsertps_avx(auVar27,ZEXT416(*(uint *)(lVar5 + 8 + lVar19)),0x20);
        auVar33._8_8_ = 0;
        auVar33._0_8_ = *(ulong *)(lVar5 + 0x34 + lVar19);
        auVar20 = vpermt2ps_avx512vl(auVar33,_DAT_02060e90,ZEXT416(*(uint *)(lVar5 + lVar19)));
        auVar46._8_8_ = 0;
        auVar46._0_8_ = *(ulong *)(lVar5 + 0x1c + lVar19);
        fVar54 = *(float *)(lVar5 + 0x24 + lVar19);
        fVar58 = *(float *)(lVar5 + 0x28 + lVar19);
        fVar59 = *(float *)(lVar5 + 0x2c + lVar19);
        auVar21 = vpermt2ps_avx512vl(auVar46,_DAT_02060e90,ZEXT416(*(uint *)(lVar5 + 0x18 + lVar19))
                                    );
        fVar60 = *(float *)(lVar5 + 0x30 + lVar19);
        auVar23 = vfmadd231ss_fma(ZEXT416((uint)(fVar58 * fVar58)),ZEXT416((uint)fVar54),
                                  ZEXT416((uint)fVar54));
        auVar23 = vfmadd231ss_fma(auVar23,ZEXT416((uint)fVar59),ZEXT416((uint)fVar59));
        auVar23 = vfmadd231ss_fma(auVar23,ZEXT416((uint)fVar60),ZEXT416((uint)fVar60));
        auVar22 = vrsqrt14ss_avx512f(ZEXT816(0),ZEXT416((uint)auVar23._0_4_));
        fVar47 = auVar22._0_4_;
        fVar47 = fVar47 * 1.5 + fVar47 * fVar47 * fVar47 * auVar23._0_4_ * -0.5;
        auVar23 = vinsertps_avx(auVar21,ZEXT416((uint)(fVar47 * fVar54)),0x30);
        a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vinsertps_avx(auVar20,ZEXT416((uint)(fVar47 * fVar58)),0x30);
        a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       vinsertps_avx(auVar24,ZEXT416((uint)(fVar47 * fVar60)),0x30);
        auVar24 = vinsertps_avx(ZEXT416(*(uint *)(lVar5 + 0xc + lVar19)),
                                ZEXT416(*(uint *)(lVar5 + 4 + lVar19)),0x10);
        auVar24 = vinsertps_avx(auVar24,ZEXT416(*(uint *)(lVar5 + 0x3c + lVar19)),0x20);
        auVar24 = vinsertps_avx(auVar24,ZEXT416((uint)(fVar59 * fVar47)),0x30);
      }
      else if (iVar39 == 0x9244) {
        lVar5 = *plVar4;
        lVar19 = uVar17 * plVar4[2];
        a0.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)
                      ((anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(lVar5 + lVar19))->v;
        auVar24 = *(undefined1 (*) [16])(lVar5 + 0x10 + lVar19);
        a0_1.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)
                        ((anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(lVar5 + 0x20 + lVar19))->
                        v;
        auVar23 = *(undefined1 (*) [16])(lVar5 + 0x30 + lVar19);
      }
      auVar21 = vshufps_avx(auVar23,auVar23,0xff);
      auVar22 = vshufps_avx((undefined1  [16])a0.field_0,(undefined1  [16])a0.field_0,0xff);
      auVar27 = vshufps_avx(auVar24,auVar24,0xff);
      auVar33 = vshufps_avx((undefined1  [16])a0_1.field_0,(undefined1  [16])a0_1.field_0,0xff);
      auVar20 = vshufps_avx((undefined1  [16])a0.field_0,ZEXT816(0) << 0x40,0xe9);
      auVar20 = vblendps_avx(auVar20,auVar24,4);
      fVar51 = auVar22._0_4_;
      auVar46 = vfmadd213ss_fma(auVar21,auVar21,ZEXT416((uint)(fVar51 * fVar51)));
      auVar46 = vfnmadd231ss_fma(auVar46,auVar27,auVar27);
      auVar34 = vfnmadd231ss_fma(auVar46,auVar33,auVar33);
      fVar47 = auVar21._0_4_;
      auVar25 = ZEXT416((uint)(auVar33._0_4_ * fVar47));
      auVar46 = vfmadd213ss_fma(auVar27,auVar22,auVar25);
      fVar54 = auVar46._0_4_ + auVar46._0_4_;
      auVar42 = ZEXT416((uint)(auVar27._0_4_ * fVar47));
      auVar46 = vfmsub213ss_fma(auVar33,auVar22,auVar42);
      fVar58 = auVar46._0_4_ + auVar46._0_4_;
      auVar46 = vfmsub231ss_fma(auVar25,auVar22,auVar27);
      fVar59 = auVar46._0_4_ + auVar46._0_4_;
      auVar46 = vfmsub231ss_fma(ZEXT416((uint)(fVar51 * fVar51)),auVar21,auVar21);
      auVar21 = vfmadd213ss_avx512f(auVar27,auVar27,auVar46);
      auVar25 = vfnmadd231ss_avx512f(auVar21,auVar33,auVar33);
      auVar21 = vfmadd213ss_avx512f(auVar33,auVar27,ZEXT416((uint)(fVar51 * fVar47)));
      auVar26 = vaddss_avx512f(auVar21,auVar21);
      auVar21 = vfmadd213ss_fma(auVar22,auVar33,auVar42);
      fVar60 = auVar21._0_4_ + auVar21._0_4_;
      auVar21 = vfmsub231ss_fma(ZEXT416((uint)(fVar51 * fVar47)),auVar27,auVar33);
      fVar47 = auVar21._0_4_ + auVar21._0_4_;
      auVar21 = vfnmadd231ss_fma(auVar46,auVar27,auVar27);
      auVar33 = vfmadd231ss_fma(auVar21,auVar33,auVar33);
      uVar35 = auVar34._0_4_;
      auVar55._4_4_ = uVar35;
      auVar55._0_4_ = uVar35;
      auVar55._8_4_ = uVar35;
      auVar55._12_4_ = uVar35;
      auVar61._4_4_ = fVar54;
      auVar61._0_4_ = fVar54;
      auVar61._8_4_ = fVar54;
      auVar61._12_4_ = fVar54;
      auVar63._0_4_ = fVar58 * 0.0;
      auVar63._4_4_ = fVar58 * 0.0;
      auVar63._8_4_ = fVar58 * 1.0;
      auVar63._12_4_ = fVar58 * 0.0;
      auVar46 = ZEXT816(0x3f80000000000000);
      auVar21 = vfmadd231ps_fma(auVar63,auVar46,auVar61);
      auVar34 = SUB6416(ZEXT464(0x3f800000),0);
      auVar22 = vfmadd231ps_fma(auVar21,auVar34,auVar55);
      auVar56._4_4_ = fVar59;
      auVar56._0_4_ = fVar59;
      auVar56._8_4_ = fVar59;
      auVar56._12_4_ = fVar59;
      auVar21 = vbroadcastss_avx512vl(auVar25);
      auVar27 = vbroadcastss_avx512vl(auVar26);
      auVar62._0_4_ = auVar27._0_4_ * 0.0;
      auVar62._4_4_ = auVar27._4_4_ * 0.0;
      auVar62._8_4_ = auVar27._8_4_ * 1.0;
      auVar62._12_4_ = auVar27._12_4_ * 0.0;
      auVar21 = vfmadd231ps_fma(auVar62,auVar46,auVar21);
      auVar27 = vfmadd231ps_fma(auVar21,auVar34,auVar56);
      auVar52._4_4_ = fVar60;
      auVar52._0_4_ = fVar60;
      auVar52._8_4_ = fVar60;
      auVar52._12_4_ = fVar60;
      auVar49._4_4_ = fVar47;
      auVar49._0_4_ = fVar47;
      auVar49._8_4_ = fVar47;
      auVar49._12_4_ = fVar47;
      fVar54 = auVar33._0_4_;
      auVar57._0_4_ = fVar54 * 0.0;
      auVar57._4_4_ = fVar54 * 0.0;
      auVar57._8_4_ = fVar54 * 1.0;
      auVar57._12_4_ = fVar54 * 0.0;
      auVar21 = vfmadd231ps_fma(auVar57,auVar46,auVar49);
      auVar21 = vfmadd231ps_fma(auVar21,auVar34,auVar52);
      auVar34._0_4_ = a0.field_0._0_4_;
      auVar34._4_4_ = auVar34._0_4_;
      auVar34._8_4_ = auVar34._0_4_;
      auVar34._12_4_ = auVar34._0_4_;
      fVar54 = auVar21._0_4_;
      auVar50._0_4_ = fVar54 * 0.0;
      fVar58 = auVar21._4_4_;
      auVar50._4_4_ = fVar58 * 0.0;
      fVar59 = auVar21._8_4_;
      auVar50._8_4_ = fVar59 * 0.0;
      fVar60 = auVar21._12_4_;
      auVar50._12_4_ = fVar60 * 0.0;
      auVar21 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar27,auVar50);
      a0_2.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vfmadd231ps_fma(auVar21,auVar22,auVar34);
      uVar35 = auVar24._0_4_;
      auVar53._4_4_ = uVar35;
      auVar53._0_4_ = uVar35;
      auVar53._8_4_ = uVar35;
      auVar53._12_4_ = uVar35;
      auVar24 = vshufps_avx(auVar24,auVar24,0x55);
      auVar24 = vfmadd213ps_fma(auVar24,auVar27,auVar50);
      a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                   vfmadd231ps_fma(auVar24,auVar22,auVar53);
      iVar39 = a0_1.field_0._0_4_;
      auVar42._4_4_ = iVar39;
      auVar42._0_4_ = iVar39;
      auVar42._8_4_ = iVar39;
      auVar42._12_4_ = iVar39;
      auVar24 = vshufps_avx((undefined1  [16])a0_1.field_0,(undefined1  [16])a0_1.field_0,0x55);
      auVar21 = vshufps_avx((undefined1  [16])a0_1.field_0,(undefined1  [16])a0_1.field_0,0xaa);
      auVar26._0_4_ = fVar54 * auVar21._0_4_;
      auVar26._4_4_ = fVar58 * auVar21._4_4_;
      auVar26._8_4_ = fVar59 * auVar21._8_4_;
      auVar26._12_4_ = fVar60 * auVar21._12_4_;
      auVar24 = vfmadd231ps_fma(auVar26,auVar27,auVar24);
      a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vfmadd231ps_fma(auVar24,auVar22,auVar42);
      uVar35 = auVar23._0_4_;
      auVar43._4_4_ = uVar35;
      auVar43._0_4_ = uVar35;
      auVar43._8_4_ = uVar35;
      auVar43._12_4_ = uVar35;
      auVar24 = vshufps_avx(auVar23,auVar23,0x55);
      auVar23 = vshufps_avx(auVar23,auVar23,0xaa);
      auVar25._0_4_ = fVar54 * auVar23._0_4_;
      auVar25._4_4_ = fVar58 * auVar23._4_4_;
      auVar25._8_4_ = fVar59 * auVar23._8_4_;
      auVar25._12_4_ = fVar60 * auVar23._12_4_;
      auVar23 = vfmadd231ps_fma(auVar25,auVar27,auVar24);
      auVar24 = vfmadd231ps_fma(auVar23,auVar22,auVar43);
      auVar23._0_4_ = auVar20._0_4_ + 0.0 + auVar24._0_4_;
      auVar23._4_4_ = auVar20._4_4_ + 0.0 + auVar24._4_4_;
      auVar23._8_4_ = auVar20._8_4_ + 0.0 + auVar24._8_4_;
      auVar23._12_4_ = auVar20._12_4_ + 0.0 + auVar24._12_4_;
    }
    else if (iVar39 == 0x9134) {
      lVar5 = *plVar4;
      lVar19 = uVar17 * plVar4[2];
      auVar23 = vinsertps_avx(ZEXT416(*(uint *)(lVar5 + lVar19)),
                              ZEXT416(*(uint *)(lVar5 + 0x10 + lVar19)),0x1c);
      a0_2.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vinsertps_avx(auVar23,ZEXT416(*(uint *)(lVar5 + 0x20 + lVar19)),0x28);
      auVar23 = vinsertps_avx(ZEXT416(*(uint *)(lVar5 + 4 + lVar19)),
                              ZEXT416(*(uint *)(lVar5 + 0x14 + lVar19)),0x1c);
      a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                   vinsertps_avx(auVar23,ZEXT416(*(uint *)(lVar5 + 0x24 + lVar19)),0x28);
      auVar23 = vinsertps_avx(ZEXT416(*(uint *)(lVar5 + 8 + lVar19)),
                              ZEXT416(*(uint *)(lVar5 + 0x18 + lVar19)),0x1c);
      a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vinsertps_avx(auVar23,ZEXT416(*(uint *)(lVar5 + 0x28 + lVar19)),0x28);
      auVar23 = vinsertps_avx(ZEXT416(*(uint *)(lVar5 + 0xc + lVar19)),
                              ZEXT416(*(uint *)(lVar5 + 0x1c + lVar19)),0x1c);
      auVar23 = vinsertps_avx(auVar23,ZEXT416(*(uint *)(lVar5 + 0x2c + lVar19)),0x28);
    }
    else if (iVar39 == 0x9234) {
      lVar5 = *plVar4;
      lVar19 = uVar17 * plVar4[2];
      auVar36._8_8_ = 0;
      auVar36._0_8_ = *(ulong *)(lVar5 + 4 + lVar19);
      auVar40._8_8_ = 0;
      auVar40._0_8_ = *(ulong *)(lVar5 + 0x10 + lVar19);
      a0_2.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar5 + lVar19)),_DAT_02060e80,auVar36);
      a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                   vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar5 + 0xc + lVar19)),_DAT_02060e80,auVar40
                                     );
      auVar37._8_8_ = 0;
      auVar37._0_8_ = *(ulong *)(lVar5 + 0x1c + lVar19);
      a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar5 + 0x18 + lVar19)),_DAT_02060e80,
                                        auVar37);
      auVar44._8_8_ = 0;
      auVar44._0_8_ = *(ulong *)(lVar5 + 0x28 + lVar19);
      auVar23 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar5 + 0x24 + lVar19)),_DAT_02060e80,auVar44);
    }
    else if (iVar39 == 0xb001) {
      lVar5 = *plVar4;
      lVar19 = uVar17 * plVar4[2];
      auVar28._8_8_ = 0;
      auVar28._0_8_ = *(ulong *)(lVar5 + 0x10 + lVar19);
      auVar24 = vinsertps_avx(auVar28,ZEXT416(*(uint *)(lVar5 + 8 + lVar19)),0x20);
      auVar29._8_8_ = 0;
      auVar29._0_8_ = *(ulong *)(lVar5 + 0x34 + lVar19);
      auVar20 = vpermt2ps_avx512vl(auVar29,_DAT_02060e90,ZEXT416(*(uint *)(lVar5 + lVar19)));
      auVar45._8_8_ = 0;
      auVar45._0_8_ = *(ulong *)(lVar5 + 0x1c + lVar19);
      fVar54 = *(float *)(lVar5 + 0x24 + lVar19);
      fVar58 = *(float *)(lVar5 + 0x28 + lVar19);
      fVar59 = *(float *)(lVar5 + 0x2c + lVar19);
      auVar21 = vpermt2ps_avx512vl(auVar45,_DAT_02060e90,ZEXT416(*(uint *)(lVar5 + 0x18 + lVar19)));
      fVar60 = *(float *)(lVar5 + 0x30 + lVar19);
      auVar23 = vfmadd231ss_fma(ZEXT416((uint)(fVar58 * fVar58)),ZEXT416((uint)fVar54),
                                ZEXT416((uint)fVar54));
      auVar23 = vfmadd231ss_fma(auVar23,ZEXT416((uint)fVar59),ZEXT416((uint)fVar59));
      auVar23 = vfmadd231ss_fma(auVar23,ZEXT416((uint)fVar60),ZEXT416((uint)fVar60));
      auVar22 = vrsqrt14ss_avx512f(ZEXT816(0),ZEXT416((uint)auVar23._0_4_));
      fVar47 = auVar22._0_4_;
      fVar47 = fVar47 * 1.5 + fVar47 * fVar47 * fVar47 * auVar23._0_4_ * -0.5;
      auVar23 = vinsertps_avx(auVar21,ZEXT416((uint)(fVar47 * fVar54)),0x30);
      a0_2.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vinsertps_avx(auVar20,ZEXT416((uint)(fVar47 * fVar58)),0x30);
      a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vinsertps_avx(auVar24,ZEXT416((uint)(fVar47 * fVar60)),0x30);
      auVar24 = vinsertps_avx(ZEXT416(*(uint *)(lVar5 + 0xc + lVar19)),
                              ZEXT416(*(uint *)(lVar5 + 4 + lVar19)),0x10);
      auVar24 = vinsertps_avx(auVar24,ZEXT416(*(uint *)(lVar5 + 0x3c + lVar19)),0x20);
      a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                   vinsertps_avx(auVar24,ZEXT416((uint)(fVar59 * fVar47)),0x30);
    }
    else if (iVar39 == 0x9244) {
      lVar5 = *plVar4;
      lVar19 = uVar17 * plVar4[2];
      a0_2.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)
                      ((anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(lVar5 + lVar19))->v;
      a0.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)
                    ((anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(lVar5 + 0x10 + lVar19))->v;
      a0_1.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)
                      ((anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(lVar5 + 0x20 + lVar19))->v;
      auVar23 = *(undefined1 (*) [16])(lVar5 + 0x30 + lVar19);
    }
    auVar24 = vshufps_avx((undefined1  [16])a0_1.field_0,(undefined1  [16])a0_1.field_0,0xc9);
    auVar20 = vshufps_avx((undefined1  [16])a0.field_0,(undefined1  [16])a0.field_0,0xc9);
    auVar48._0_4_ = a0_1.field_0._0_4_ * auVar20._0_4_;
    auVar48._4_4_ = a0_1.field_0._4_4_ * auVar20._4_4_;
    auVar48._8_4_ = a0_1.field_0._8_4_ * auVar20._8_4_;
    auVar48._12_4_ = a0_1.field_0._12_4_ * auVar20._12_4_;
    auVar27 = vfmsub231ps_fma(auVar48,(undefined1  [16])a0.field_0,auVar24);
    auVar21 = vshufps_avx(auVar27,auVar27,0xc9);
    auVar22 = vshufps_avx((undefined1  [16])a0_2.field_0,(undefined1  [16])a0_2.field_0,0xc9);
    auVar41._0_4_ = a0_2.field_0._0_4_ * auVar24._0_4_;
    auVar41._4_4_ = a0_2.field_0._4_4_ * auVar24._4_4_;
    auVar41._8_4_ = a0_2.field_0._8_4_ * auVar24._8_4_;
    auVar41._12_4_ = a0_2.field_0._12_4_ * auVar24._12_4_;
    auVar33 = vfmsub231ps_fma(auVar41,auVar22,(undefined1  [16])a0_1.field_0);
    auVar31._0_4_ = auVar22._0_4_ * a0.field_0._0_4_;
    auVar31._4_4_ = auVar22._4_4_ * a0.field_0._4_4_;
    auVar31._8_4_ = auVar22._8_4_ * a0.field_0._8_4_;
    auVar31._12_4_ = auVar22._12_4_ * a0.field_0._12_4_;
    auVar20 = vfmsub231ps_fma(auVar31,(undefined1  [16])a0_2.field_0,auVar20);
    auVar24 = vshufps_avx(auVar20,auVar20,0xc9);
    auVar22 = vunpcklps_avx(auVar21,auVar24);
    auVar24 = vunpcklps_avx(auVar27,auVar20);
    auVar20 = vinsertps_avx(auVar33,auVar33,0x4a);
    auVar27 = vunpcklps_avx(auVar24,ZEXT416(auVar33._0_4_));
    auVar24 = vdpps_avx((undefined1  [16])a0_2.field_0,auVar21,0x7f);
    auVar21 = vunpcklps_avx(auVar22,auVar20);
    auVar20 = vunpckhps_avx(auVar22,auVar20);
    auVar30._0_4_ = auVar24._0_4_;
    auVar30._4_4_ = auVar30._0_4_;
    auVar30._8_4_ = auVar30._0_4_;
    auVar30._12_4_ = auVar30._0_4_;
    auVar24 = vdivps_avx(auVar21,auVar30);
    auVar20 = vdivps_avx(auVar20,auVar30);
    auVar21 = vdivps_avx(auVar27,auVar30);
    uVar35 = auVar23._0_4_;
    auVar32._4_4_ = uVar35;
    auVar32._0_4_ = uVar35;
    auVar32._8_4_ = uVar35;
    auVar32._12_4_ = uVar35;
    auVar22 = vshufps_avx(auVar23,auVar23,0x55);
    auVar23 = vshufps_avx(auVar23,auVar23,0xaa);
    auVar38._0_4_ = auVar23._0_4_ * auVar21._0_4_;
    auVar38._4_4_ = auVar23._4_4_ * auVar21._4_4_;
    auVar38._8_4_ = auVar23._8_4_ * auVar21._8_4_;
    auVar38._12_4_ = auVar23._12_4_ * auVar21._12_4_;
    auVar23 = vfmadd231ps_fma(auVar38,auVar20,auVar22);
    auVar23 = vfmadd231ps_fma(auVar23,auVar24,auVar32);
    uVar13 = *(undefined8 *)&(ray->super_RayK<1>).org.field_0;
    uVar14 = *(undefined8 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
    uVar15 = *(undefined8 *)&(ray->super_RayK<1>).dir.field_0;
    uVar16 = *(undefined8 *)((long)&(ray->super_RayK<1>).dir.field_0 + 8);
    uVar35 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
    auVar7._4_4_ = uVar35;
    auVar7._0_4_ = uVar35;
    auVar7._8_4_ = uVar35;
    auVar7._12_4_ = uVar35;
    auVar23 = vfmsub231ps_avx512vl(auVar23,auVar21,auVar7);
    uVar35 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
    auVar8._4_4_ = uVar35;
    auVar8._0_4_ = uVar35;
    auVar8._8_4_ = uVar35;
    auVar8._12_4_ = uVar35;
    auVar23 = vfmadd231ps_avx512vl(auVar23,auVar20,auVar8);
    uVar35 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
    auVar9._4_4_ = uVar35;
    auVar9._0_4_ = uVar35;
    auVar9._8_4_ = uVar35;
    auVar9._12_4_ = uVar35;
    auVar23 = vfmadd231ps_avx512vl(auVar23,auVar24,auVar9);
    aVar6 = (anon_union_16_2_47237d3f_for_Vec3fx_0)
            vinsertps_avx(auVar23,ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]),0x30);
    (ray->super_RayK<1>).org.field_0 = aVar6;
    uVar35 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 8);
    auVar10._4_4_ = uVar35;
    auVar10._0_4_ = uVar35;
    auVar10._8_4_ = uVar35;
    auVar10._12_4_ = uVar35;
    auVar23 = vmulps_avx512vl(auVar21,auVar10);
    uVar35 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 4);
    auVar11._4_4_ = uVar35;
    auVar11._0_4_ = uVar35;
    auVar11._8_4_ = uVar35;
    auVar11._12_4_ = uVar35;
    auVar23 = vfmadd231ps_avx512vl(auVar23,auVar20,auVar11);
    uVar35 = *(undefined4 *)&(ray->super_RayK<1>).dir.field_0;
    auVar12._4_4_ = uVar35;
    auVar12._0_4_ = uVar35;
    auVar12._8_4_ = uVar35;
    auVar12._12_4_ = uVar35;
    auVar23 = vfmadd231ps_avx512vl(auVar23,auVar24,auVar12);
    aVar6 = (anon_union_16_2_47237d3f_for_Vec3fx_0)
            vinsertps_avx(auVar23,ZEXT416((uint)(ray->super_RayK<1>).dir.field_0.m128[3]),0x30);
    (ray->super_RayK<1>).dir.field_0 = aVar6;
    (**(code **)(p_Var18 + 0x78))(p_Var18 + 0x58,ray);
    *(undefined8 *)&(ray->super_RayK<1>).org.field_0 = uVar13;
    *(undefined8 *)((long)&(ray->super_RayK<1>).org.field_0 + 8) = uVar14;
    *(undefined8 *)&(ray->super_RayK<1>).dir.field_0 = uVar15;
    *(undefined8 *)((long)&(ray->super_RayK<1>).dir.field_0 + 8) = uVar16;
    pRVar3->instID[0] = 0xffffffff;
    pRVar3->instPrimID[0] = 0xffffffff;
  }
  return;
}

Assistant:

void InstanceArrayIntersector1::intersect(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
    {
      InstanceArray* instance = context->scene->get<InstanceArray>(prim.instID_);
      Accel* object = instance->getObject(prim.primID_);
      if (!object) return;

      /* perform ray mask test */
#if defined(EMBREE_RAY_MASK)
      if ((ray.mask & instance->mask) == 0) 
        return;
#endif

      RTCRayQueryContext* user_context = context->user;
      if (likely(instance_id_stack::push(user_context, prim.instID_, prim.primID_)))
      {
        const AffineSpace3fa world2local = instance->getWorld2Local(prim.primID_);
        const Vec3ff ray_org = ray.org;
        const Vec3ff ray_dir = ray.dir;
        ray.org = Vec3ff(xfmPoint(world2local, ray_org), ray.tnear());
        ray.dir = Vec3ff(xfmVector(world2local, ray_dir), ray.time());
        RayQueryContext newcontext((Scene*)object, user_context, context->args);
        object->intersectors.intersect((RTCRayHit&)ray, &newcontext);
        ray.org = ray_org;
        ray.dir = ray_dir;
        instance_id_stack::pop(user_context);
      }
    }